

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

void __thiscall
Genome::Genome(Genome *this,string *name,int length,double transcript_degradation_rate_ext,
              double rnase_speed,double rnase_footprint,double transcript_degradation_rate)

{
  _Rb_tree_header *p_Var1;
  runtime_error *this_00;
  
  Polymer::Polymer(&this->super_Polymer,name,1,length);
  (this->super_Polymer)._vptr_Polymer = (_func_int **)&PTR_Initialize_0019d8f0;
  p_Var1 = &(this->transcript_signal_).slots_._M_t._M_impl.super__Rb_tree_header;
  (this->transcript_signal_).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->transcript_signal_).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->transcript_signal_).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->transcript_signal_).slots_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->transcript_signal_).slots_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->transcript_signal_).current_id_ = 0;
  memset(&this->transcript_rbs_intervals_,0,0x90);
  (this->seq_)._M_dataplus._M_p = (pointer)&(this->seq_).field_2;
  (this->seq_)._M_string_length = 0;
  (this->seq_).field_2._M_local_buf[0] = '\0';
  (this->weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->weights_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->bindings_)._M_t._M_impl.super__Rb_tree_header;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->bindings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->rnase_bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->rnase_bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->rnase_bindings_)._M_t._M_impl.super__Rb_tree_header;
  (this->rnase_bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->rnase_bindings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->rnase_bindings_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->transcript_degradation_rate_ = transcript_degradation_rate;
  this->transcript_degradation_rate_ext_ = transcript_degradation_rate_ext;
  this->rnase_speed_ = rnase_speed;
  this->rnase_footprint_ = (int)rnase_footprint;
  if (((((transcript_degradation_rate_ext != 0.0) || (NAN(transcript_degradation_rate_ext))) ||
       (transcript_degradation_rate != 0.0)) || (NAN(transcript_degradation_rate))) &&
     (((rnase_speed == 0.0 && (!NAN(rnase_speed))) || ((int)rnase_footprint == 0)))) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"Please specify \'rnase_speed\' and/or \'rnase_footprint\'");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

Genome::Genome(const std::string &name, int length,
               double transcript_degradation_rate_ext,
               double rnase_speed, double rnase_footprint,
               double transcript_degradation_rate)
    : Polymer(name, 1, length),
      transcript_degradation_rate_(transcript_degradation_rate),
      transcript_degradation_rate_ext_(transcript_degradation_rate_ext),
      rnase_speed_(rnase_speed),
      rnase_footprint_(rnase_footprint) {
  /*transcript_weights_ = std::vector<double>(length, 1.0);*/
  if (transcript_degradation_rate_ext != 0 || transcript_degradation_rate != 0) {
    if (!(rnase_speed_ != 0 && rnase_footprint_ != 0)) {
      throw std::runtime_error(
        "Please specify 'rnase_speed' and/or 'rnase_footprint'");
    }
  }
}